

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O1

void Dtt_PrintMulti(Dtt_Man_t *p)

{
  uint uVar1;
  int *piVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  int iVar8;
  ulong uVar9;
  int *__s;
  ulong uVar10;
  double dVar11;
  int Counts [13] [15];
  int local_348 [198];
  
  __s = local_348;
  uVar10 = 0;
  memset(__s,0,0x30c);
  while( true ) {
    iVar8 = p->nClasses;
    if ((long)iVar8 < 1) {
      dVar11 = 0.0;
      uVar9 = 0;
    }
    else {
      piVar2 = p->pNodes;
      lVar4 = 0;
      uVar9 = 0;
      iVar5 = 0;
      do {
        if (uVar10 == (uint)piVar2[lVar4]) {
          uVar1 = p->pTimes[lVar4];
          uVar6 = uVar1;
          if (1 < uVar1) {
            uVar6 = uVar1 - 1;
            if (uVar6 == 0) {
              uVar6 = 0;
            }
            else {
              uVar3 = 0x1f;
              if (uVar6 != 0) {
                for (; uVar6 >> uVar3 == 0; uVar3 = uVar3 - 1) {
                }
              }
              uVar6 = (uVar3 ^ 0xffffffe0) + 0x21;
            }
          }
          if (0xe < uVar6) {
            __assert_fail("Log < 15",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNpn2.c"
                          ,0x298,"void Dtt_PrintMulti(Dtt_Man_t *)");
          }
          piVar7 = local_348 + uVar10 * 0xf + uVar6;
          if ((int)uVar1 < 2) {
            piVar7 = local_348 + uVar10 * 0xf;
          }
          *piVar7 = *piVar7 + 1;
          iVar5 = iVar5 + uVar1;
          uVar9 = (ulong)((int)uVar9 + 1);
        }
        lVar4 = lVar4 + 1;
      } while (iVar8 != lVar4);
      dVar11 = (double)iVar5;
    }
    iVar8 = (int)uVar9;
    if (iVar8 == 0) {
      return;
    }
    printf("n=%2d : ",uVar10 & 0xffffffff);
    printf("All = %7d  ",uVar9);
    printf("Ave = %6.2f  ",dVar11 / (double)iVar8);
    lVar4 = 0;
    do {
      if (__s[lVar4] == 0) {
        printf("%6s");
      }
      else {
        printf("%6d");
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0xf);
    putchar(10);
    if (iVar8 == 0) break;
    uVar10 = uVar10 + 1;
    __s = __s + 0xf;
    if (uVar10 == 0xd) {
      return;
    }
  }
  return;
}

Assistant:

void Dtt_PrintMulti( Dtt_Man_t * p )
{
    int n, Counts[13][15] = {{0}};
    for ( n = 0; n < 13; n++ )
    {
        int i, Total = 0, Count = 0;
        for ( i = 0; i < p->nClasses; i++ )
            if ( p->pNodes[i] == n )
            {
                int Log = Abc_Base2Log(p->pTimes[i]);
                assert( Log < 15 );
                if ( p->pTimes[i] < 2 )
                    Counts[n][0]++;
                else
                    Counts[n][Log]++;
                Total += p->pTimes[i];
                Count++;
            }
        if ( Count == 0 )
            break;
        printf( "n=%2d : ", n );
        printf( "All = %7d  ", Count );
        printf( "Ave = %6.2f  ", 1.0*Total/Count );
        for ( i = 0; i < 15; i++ )
            if ( Counts[n][i] )
                printf( "%6d", Counts[n][i] );
            else
                printf( "%6s", "" );
        printf( "\n" );
    }
}